

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O1

int wally_scriptpubkey_multisig_from_bytes
              (uchar *bytes,size_t bytes_len,uint32_t threshold,uint32_t flags,uchar *bytes_out,
              size_t len,size_t *written)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uchar *puVar9;
  undefined8 *__dest;
  uchar uVar10;
  ulong __nmemb;
  uchar pubkey_bytes [495];
  undefined8 local_228 [63];
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = bytes_len;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  iVar6 = -2;
  if (bytes_len != 0 && bytes != (uchar *)0x0) {
    __nmemb = bytes_len / 0x21;
    if (((threshold <= __nmemb &&
         (0xfffffff0 < threshold - 0x10 && 0xfffffffffffffe10 < bytes_len - 0x210)) &&
         bytes_len == __nmemb * 0x21) &&
       ((bytes_out != (uchar *)0x0 && (flags & 0xfffffff7) == 0) && written != (size_t *)0x0)) {
      uVar7 = __nmemb * 0x20 + (SUB168(auVar1 * ZEXT816(0xf83e0f83e0f83e1),8) & 0xfffffffffffffffe)
              + 3;
      if (uVar7 <= len) {
        __dest = local_228;
        memcpy(__dest,bytes,bytes_len);
        if (flags != 0) {
          qsort(local_228,__nmemb,0x21,pubkey_compare);
        }
        bVar5 = (byte)threshold | 0x50;
        if (threshold == 0) {
          bVar5 = 0;
        }
        *bytes_out = bVar5;
        puVar9 = bytes_out + 1;
        uVar8 = __nmemb;
        if (0x20 < bytes_len) {
          do {
            *puVar9 = '!';
            uVar2 = __dest[1];
            uVar3 = __dest[2];
            uVar4 = __dest[3];
            *(undefined8 *)(puVar9 + 1) = *__dest;
            *(undefined8 *)(puVar9 + 9) = uVar2;
            *(undefined8 *)(puVar9 + 0x11) = uVar3;
            *(undefined8 *)(puVar9 + 0x19) = uVar4;
            puVar9[0x21] = *(uchar *)(__dest + 4);
            puVar9 = puVar9 + 0x22;
            __dest = (undefined8 *)((long)__dest + 0x21);
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        wally_clear(local_228,0x1ef);
        uVar10 = (char)__nmemb + 'P';
        if (bytes_len < 0x21) {
          uVar10 = '\0';
        }
        *puVar9 = uVar10;
        puVar9[1] = 0xae;
      }
      *written = uVar7;
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int wally_scriptpubkey_multisig_from_bytes(
    const unsigned char *bytes, size_t bytes_len, uint32_t threshold,
    uint32_t flags, unsigned char *bytes_out, size_t len, size_t *written)
{
    size_t n_pubkeys = bytes_len / EC_PUBLIC_KEY_LEN;
    size_t script_len = 3 + (n_pubkeys * (EC_PUBLIC_KEY_LEN + 1));
    size_t i;
    unsigned char pubkey_bytes[15 * EC_PUBLIC_KEY_LEN];

    if (written)
        *written = 0;

    if (!bytes || !bytes_len || bytes_len % EC_PUBLIC_KEY_LEN ||
        n_pubkeys < 1 || n_pubkeys > 15 || threshold < 1 || threshold > 15 ||
        threshold > n_pubkeys || (flags & ~WALLY_SCRIPT_MULTISIG_SORTED) ||
        !bytes_out || !written)
        return WALLY_EINVAL;

    if (len < script_len) {
        *written = script_len;
        return WALLY_OK;
    }

    memcpy(pubkey_bytes, bytes, bytes_len);
    if (flags & WALLY_SCRIPT_MULTISIG_SORTED) {
        qsort(pubkey_bytes, n_pubkeys, EC_PUBLIC_KEY_LEN, pubkey_compare);
    }

    *bytes_out++ = value_to_op_n(threshold);
    for (i = 0; i < n_pubkeys; ++i) {
        *bytes_out++ = EC_PUBLIC_KEY_LEN;
        memcpy(bytes_out, pubkey_bytes + i * EC_PUBLIC_KEY_LEN, EC_PUBLIC_KEY_LEN);
        bytes_out += EC_PUBLIC_KEY_LEN;
    }
    wally_clear(pubkey_bytes, sizeof(pubkey_bytes));
    *bytes_out++ = value_to_op_n(n_pubkeys);
    *bytes_out = OP_CHECKMULTISIG;
    *written = script_len;
    return WALLY_OK;
}